

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-interp.cc
# Opt level: O2

void __thiscall InterpTest_Fac_Trace_Test::TestBody(InterpTest_Fac_Trace_Test *this)

{
  pointer *__ptr;
  char *message;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_e8;
  undefined8 local_e0;
  unique_ptr<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_> buf;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Stack_d0;
  undefined8 local_c8;
  Result result;
  MemoryStream stream;
  AssertHelper local_90;
  Ptr trap;
  Values results;
  Ptr func;
  
  InterpTest::ReadModule
            (&this->super_InterpTest,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             (anonymous_namespace)::s_fac_module);
  stream.super_Stream._vptr_Stream = (_func_int **)0x0;
  stream.super_Stream.offset_ = 0;
  stream.super_Stream.result_.enum_ = Ok;
  stream.super_Stream._20_4_ = 0;
  InterpTest::Instantiate(&this->super_InterpTest,(RefVec *)&stream);
  std::_Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::~_Vector_base
            ((_Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_> *)&stream);
  InterpTest::GetFuncExport(&func,&this->super_InterpTest,0);
  results.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  results.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  results.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  trap.obj_ = (Trap *)0x0;
  trap.store_ = (Store *)0x0;
  trap.root_index_ = 0;
  wabt::MemoryStream::MemoryStream(&stream,(Stream *)0x0);
  local_e8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
  local_e0 = 0;
  buf._M_t.super___uniq_ptr_impl<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_>._M_t.
  super__Tuple_impl<0UL,_wabt::OutputBuffer_*,_std::default_delete<wabt::OutputBuffer>_>.
  super__Head_base<0UL,_wabt::OutputBuffer_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>,_true,_true>)
       (__uniq_ptr_impl<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_>)0x0;
  _Stack_d0._M_head_impl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_c8 = 0;
  std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>::
  _M_range_initialize<wabt::interp::Value_const*>
            ((vector<wabt::interp::Value,std::allocator<wabt::interp::Value>> *)&buf,&local_e8);
  result = wabt::interp::Func::Call
                     (&(func.obj_)->super_Func,&(this->super_InterpTest).store_,(Values *)&buf,
                      &results,&trap,&stream.super_Stream);
  std::_Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::~_Vector_base
            ((_Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> *)&buf);
  local_e8._M_head_impl = local_e8._M_head_impl & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<wabt::Result::Enum,wabt::Result>
            ((internal *)&buf,"Result::Ok","result",(Enum *)&local_e8,&result);
  if ((char)buf._M_t.
            super___uniq_ptr_impl<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_>._M_t
            .super__Tuple_impl<0UL,_wabt::OutputBuffer_*,_std::default_delete<wabt::OutputBuffer>_>.
            super__Head_base<0UL,_wabt::OutputBuffer_*,_false>._M_head_impl == '\0') {
    testing::Message::Message((Message *)&local_e8);
    if (_Stack_d0._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((_Stack_d0._M_head_impl)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/test-interp.cc"
               ,0xba,message);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if (local_e8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_e8._M_head_impl + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&_Stack_d0);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&_Stack_d0);
    wabt::MemoryStream::ReleaseOutputBuffer(&stream);
    InterpTest::ExpectBufferStrEq
              (&this->super_InterpTest,
               (OutputBuffer *)
               buf._M_t.
               super___uniq_ptr_impl<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_>.
               _M_t.
               super__Tuple_impl<0UL,_wabt::OutputBuffer_*,_std::default_delete<wabt::OutputBuffer>_>
               .super__Head_base<0UL,_wabt::OutputBuffer_*,_false>._M_head_impl,
               "#0.    0: V:1  | alloca 1\n#0.    8: V:2  | i32.const 1\n#0.   16: V:3  | local.set $2, 1\n#0.   24: V:2  | local.get $1\n#0.   32: V:3  | local.get $3\n#0.   40: V:4  | i32.eqz 2\n#0.   44: V:4  | br_unless @60, 0\n#0.   60: V:3  | local.get $3\n#0.   68: V:4  | i32.mul 1, 2\n#0.   72: V:3  | local.set $2, 2\n#0.   80: V:2  | local.get $2\n#0.   88: V:3  | i32.const 1\n#0.   96: V:4  | i32.sub 2, 1\n#0.  100: V:3  | local.set $3, 1\n#0.  108: V:2  | br @24\n#0.   24: V:2  | local.get $1\n#0.   32: V:3  | local.get $3\n#0.   40: V:4  | i32.eqz 1\n#0.   44: V:4  | br_unless @60, 0\n#0.   60: V:3  | local.get $3\n#0.   68: V:4  | i32.mul 2, 1\n#0.   72: V:3  | local.set $2, 2\n#0.   80: V:2  | local.get $2\n#0.   88: V:3  | i32.const 1\n#0.   96: V:4  | i32.sub 1, 1\n#0.  100: V:3  | local.set $3, 0\n#0.  108: V:2  | br @24\n#0.   24: V:2  | local.get $1\n#0.   32: V:3  | local.get $3\n#0.   40: V:4  | i32.eqz 0\n#0.   44: V:4  | br_unless @60, 1\n#0.   52: V:3  | br @116\n#0.  116: V:3  | drop_keep $2 $1\n#0.  128: V:1  | return\n"
              );
    std::unique_ptr<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_>::~unique_ptr(&buf)
    ;
  }
  wabt::MemoryStream::~MemoryStream(&stream);
  wabt::interp::RefPtr<wabt::interp::Trap>::reset(&trap);
  std::_Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::~_Vector_base
            (&results.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>)
  ;
  wabt::interp::RefPtr<wabt::interp::DefinedFunc>::reset(&func);
  return;
}

Assistant:

TEST_F(InterpTest, Fac_Trace) {
  ReadModule(s_fac_module);
  Instantiate();
  auto func = GetFuncExport(0);

  Values results;
  Trap::Ptr trap;
  MemoryStream stream;
  Result result = func->Call(store_, {Value::Make(2)}, results, &trap, &stream);
  ASSERT_EQ(Result::Ok, result);

  auto buf = stream.ReleaseOutputBuffer();
  ExpectBufferStrEq(*buf,
R"(#0.    0: V:1  | alloca 1
#0.    8: V:2  | i32.const 1
#0.   16: V:3  | local.set $2, 1
#0.   24: V:2  | local.get $1
#0.   32: V:3  | local.get $3
#0.   40: V:4  | i32.eqz 2
#0.   44: V:4  | br_unless @60, 0
#0.   60: V:3  | local.get $3
#0.   68: V:4  | i32.mul 1, 2
#0.   72: V:3  | local.set $2, 2
#0.   80: V:2  | local.get $2
#0.   88: V:3  | i32.const 1
#0.   96: V:4  | i32.sub 2, 1
#0.  100: V:3  | local.set $3, 1
#0.  108: V:2  | br @24
#0.   24: V:2  | local.get $1
#0.   32: V:3  | local.get $3
#0.   40: V:4  | i32.eqz 1
#0.   44: V:4  | br_unless @60, 0
#0.   60: V:3  | local.get $3
#0.   68: V:4  | i32.mul 2, 1
#0.   72: V:3  | local.set $2, 2
#0.   80: V:2  | local.get $2
#0.   88: V:3  | i32.const 1
#0.   96: V:4  | i32.sub 1, 1
#0.  100: V:3  | local.set $3, 0
#0.  108: V:2  | br @24
#0.   24: V:2  | local.get $1
#0.   32: V:3  | local.get $3
#0.   40: V:4  | i32.eqz 0
#0.   44: V:4  | br_unless @60, 1
#0.   52: V:3  | br @116
#0.  116: V:3  | drop_keep $2 $1
#0.  128: V:1  | return
)");
}